

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidationcache_tests.cpp
# Opt level: O3

void __thiscall
txvalidationcache_tests::tx_mempool_block_doublespend::test_method
          (tx_mempool_block_doublespend *this)

{
  CKey *this_00;
  pointer pCVar1;
  uint uVar2;
  long lVar3;
  element_type *peVar4;
  pointer pCVar5;
  pointer pCVar6;
  CTxMemPool *pCVar7;
  uint uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  void *pvVar12;
  undefined1 auVar13 [16];
  pointer psVar14;
  undefined3 uVar15;
  undefined5 uVar16;
  pointer psVar17;
  bool bVar18;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_01;
  long lVar19;
  Chainstate *pCVar20;
  RecursiveMutex *pRVar21;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar22;
  uint256 *puVar23;
  undefined8 *puVar24;
  iterator pvVar25;
  lazy_ostream *plVar26;
  iterator pvVar27;
  bool bVar28;
  long in_FS_OFFSET;
  byte bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  check_type cVar38;
  undefined4 local_434;
  undefined8 local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  assertion_result local_248;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> spends;
  undefined1 local_1b8 [8];
  assertion_result local_1b0;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> oneSpend;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  undefined1 local_168 [16];
  undefined1 local_158 [12];
  uint uStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_118;
  uchar auStack_100 [8];
  direct_or_indirect local_f8;
  uint local_dc;
  uint256 hash;
  undefined1 local_88 [16];
  pointer local_78;
  uchar local_70 [2];
  bool local_6e;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  
  bVar29 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  _local_158 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  this_00 = &(this->super_Dersig100Setup).super_TestChain100Setup.coinbaseKey;
  CKey::GetPubKey((CPubKey *)&hash,this_00);
  ToByteVector<CPubKey>(&vchSig,(CPubKey *)&hash);
  this_01 = &CScript::operator<<((CScript *)local_168,&vchSig)->super_CScriptBase;
  uVar2 = this_01->_size;
  uVar8 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar8 = uVar2;
  }
  ppVar22 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (this_01->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar22 = this_01;
  }
  local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_01,(uchar *)((long)&ppVar22->_union + (long)(int)uVar8),(uchar *)&local_248);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents,this_01
            );
  pvVar12 = (void *)CONCAT17(vchSig.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._7_1_,
                             CONCAT16(vchSig.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start._6_1_,
                                      CONCAT15(vchSig.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._5_1_,
                                               CONCAT14(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_1_,
                                                  CONCAT13(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)))))));
  if (pvVar12 != (void *)0x0) {
    operator_delete(pvVar12,CONCAT17(vchSig.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                                     CONCAT16(vchSig.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _6_1_,CONCAT15(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._5_1_,CONCAT14(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_1_,CONCAT13(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._3_1_,CONCAT12(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._2_1_,CONCAT11(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._1_1_,(uchar)vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ))))))) - (long)pvVar12);
  }
  if (0x1c < uStack_14c) {
    free((void *)local_168._0_8_);
  }
  spends.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  spends.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  spends.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::resize(&spends,2);
  lVar19 = 0;
  bVar18 = true;
  do {
    bVar28 = bVar18;
    spends.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
    super__Vector_impl_data._M_start[lVar19].version = 1;
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              (&spends.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar19].vin,1);
    peVar4 = (((this->super_Dersig100Setup).super_TestChain100Setup.m_coinbase_txns.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pCVar1 = spends.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
             _M_impl.super__Vector_impl_data._M_start + lVar19;
    pCVar5 = (pCVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = *(undefined8 *)&(peVar4->hash).m_wrapped;
    uVar10 = *(undefined8 *)((long)&peVar4->hash + 8);
    uVar11 = *(undefined8 *)((long)&peVar4->hash + 0x18);
    *(undefined8 *)((long)&(pCVar5->prevout).hash + 0x10) =
         *(undefined8 *)((long)&peVar4->hash + 0x10);
    *(undefined8 *)((long)&(pCVar5->prevout).hash + 0x18) = uVar11;
    *(undefined8 *)&(pCVar5->prevout).hash = uVar9;
    *(undefined8 *)((long)&(pCVar5->prevout).hash + 8) = uVar10;
    (((pCVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).n = 0;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&pCVar1->vout,1);
    pCVar6 = spends.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar19].vout.
             super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pCVar6->nValue = (CAmount)&LAB_00a7d8b9_7;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(pCVar6->scriptPubKey).super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._1_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._2_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._3_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._4_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._5_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._6_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._7_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._1_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._2_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._3_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._4_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._5_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._6_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._7_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_168._8_8_;
    local_168 = auVar13 << 0x40;
    pvVar25 = (iterator)0x1;
    plVar26 = (lazy_ostream *)local_168;
    SignatureHash<CMutableTransaction>
              (&hash,(CScript *)&local_f8.indirect_contents,
               spends.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar19,0,1,(CAmount *)local_168,BASE,
               (PrecomputedTransactionData *)0x0);
    local_1e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_1e0 = "";
    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x3e;
    file.m_begin = (iterator)&local_1e8;
    msg.m_end = (iterator)plVar26;
    msg.m_begin = pvVar25;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1f8,msg);
    _cVar38 = 0x6b471e;
    bVar18 = CKey::Sign(this_00,&hash,&vchSig,true,0);
    local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar18;
    local_248.m_message.px = (element_type *)0x0;
    local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1b0._0_8_ = anon_var_dwarf_1b2c713;
    local_1b0.m_message.px = (element_type *)(anon_var_dwarf_1b2c713 + 0x1e);
    local_168[8] = 0;
    local_168._0_8_ = &PTR__lazy_ostream_013ae1c8;
    stack0xfffffffffffffeb0 = &local_1b0;
    local_158._0_8_ = boost::unit_test::lazy_ostream::inst;
    local_208 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_200 = "";
    pvVar25 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_248,(lazy_ostream *)local_168,1,0,WARN,_cVar38,(size_t)&local_208,0x3e);
    boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
    local_168[0] = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vchSig,(uchar *)local_168);
    CScript::operator<<(&(spends.
                          super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar19].vin.
                          super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start)->scriptSig,&vchSig);
    pvVar12 = (void *)CONCAT17(vchSig.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._7_1_,
                               CONCAT16(vchSig.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start._6_1_,
                                        CONCAT15(vchSig.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._5_1_,
                                                 CONCAT14(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_1_,
                                                  CONCAT13(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)))))));
    if (pvVar12 != (void *)0x0) {
      operator_delete(pvVar12,CONCAT17(vchSig.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                                       CONCAT16(vchSig.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                                _6_1_,CONCAT15(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._5_1_,CONCAT14(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_1_,CONCAT13(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._3_1_,CONCAT12(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._2_1_,CONCAT11(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._1_1_,(uchar)vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ))))))) - (long)pvVar12);
    }
    lVar19 = 1;
    bVar18 = false;
  } while (bVar28);
  local_118.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_100[0] = '\0';
  auStack_100[1] = '\0';
  auStack_100[2] = 0;
  local_118.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_3_ = 0;
  local_118.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._3_5_ = 0;
  local_128 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  _local_158 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  pvVar27 = (iterator)0x0;
  TestChain100Setup::CreateAndProcessBlock
            ((CBlock *)&hash,(TestChain100Setup *)this,&spends,
             (CScript *)&local_f8.indirect_contents,(Chainstate *)0x0);
  puVar23 = &hash;
  puVar24 = (undefined8 *)local_168;
  for (lVar19 = 10;
      psVar17 = local_118.
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
      uVar16 = local_118.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish._3_5_,
      uVar15 = local_118.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish._0_3_,
      psVar14 = local_118.
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start, lVar19 != 0; lVar19 = lVar19 + -1) {
    *puVar24 = *(undefined8 *)(puVar23->super_base_blob<256U>).m_data._M_elems;
    puVar23 = (uint256 *)((long)puVar23 + (ulong)bVar29 * -0x10 + 8);
    puVar24 = puVar24 + (ulong)bVar29 * -2 + 1;
  }
  local_118.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
  local_118.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
  local_118.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_3_ = local_88._8_3_;
  local_118.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._3_5_ = local_88._11_5_;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = (uchar)psVar14;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._1_1_ = (uchar)((ulong)psVar14 >> 8);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._2_1_ = (uchar)((ulong)psVar14 >> 0x10);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._3_1_ = (uchar)((ulong)psVar14 >> 0x18);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._4_1_ = (uchar)((ulong)psVar14 >> 0x20);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._5_1_ = (uchar)((ulong)psVar14 >> 0x28);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._6_1_ = (uchar)((ulong)psVar14 >> 0x30);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._7_1_ = (uchar)((ulong)psVar14 >> 0x38);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = (uchar)uVar15;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._1_1_ = (uchar)((uint3)uVar15 >> 8);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._2_1_ = (uchar)((uint3)uVar15 >> 0x10);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._3_1_ = (uchar)uVar16;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._4_1_ = (uchar)((uint5)uVar16 >> 8);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._5_1_ = (uchar)((uint5)uVar16 >> 0x10);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._6_1_ = (uchar)((uint5)uVar16 >> 0x18);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._7_1_ = (uchar)((uint5)uVar16 >> 0x20);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = (uchar)psVar17;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_1_ = (uchar)((ulong)psVar17 >> 8);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_1_ = (uchar)((ulong)psVar17 >> 0x10);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = (uchar)((ulong)psVar17 >> 0x18);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = (uchar)((ulong)psVar17 >> 0x20);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = (uchar)((ulong)psVar17 >> 0x28);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = (uchar)((ulong)psVar17 >> 0x30);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = (uchar)((ulong)psVar17 >> 0x38);
  local_88 = (undefined1  [16])0x0;
  local_78 = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&vchSig);
  auStack_100[2] = local_6e;
  auStack_100[0] = local_70[0];
  auStack_100[1] = local_70[1];
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_88);
  oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._0_9_ = ZEXT89(0x13c1538);
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&oneSpend);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x49;
  file_00.m_begin = (iterator)&local_218;
  msg_00.m_end = pvVar25;
  msg_00.m_begin = pvVar27;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_228,
             msg_00);
  pCVar20 = ChainstateManager::ActiveChainstate
                      ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                       super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  puVar23 = (pCVar20->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]->phashBlock;
  if (puVar23 != (uint256 *)0x0) {
    hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(puVar23->super_base_blob<256U>).m_data._M_elems;
    hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((puVar23->super_base_blob<256U>).m_data._M_elems + 8);
    hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((puVar23->super_base_blob<256U>).m_data._M_elems + 0x10);
    hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((puVar23->super_base_blob<256U>).m_data._M_elems + 0x18);
    _cVar38 = 0x6b49cf;
    CBlockHeader::GetHash((uint256 *)&vchSig,(CBlockHeader *)local_168);
    auVar34[0] = -((uchar)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage ==
                  hash.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar34[1] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._1_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar34[2] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._2_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar34[3] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._3_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar34[4] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar34[5] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._5_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar34[6] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._6_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar34[7] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._7_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar34[8] = -(uStack_40 == hash.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar34[9] = -(uStack_3f == hash.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar34[10] = -(uStack_3e == hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar34[0xb] = -(uStack_3d == hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar34[0xc] = -(uStack_3c == hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar34[0xd] = -(uStack_3b == hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar34[0xe] = -(uStack_3a == hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar34[0xf] = -(uStack_39 == hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar30[0] = -((uchar)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start ==
                  hash.super_base_blob<256U>.m_data._M_elems[0]);
    auVar30[1] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._1_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[1]);
    auVar30[2] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._2_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[2]);
    auVar30[3] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._3_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[3]);
    auVar30[4] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._4_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[4]);
    auVar30[5] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._5_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[5]);
    auVar30[6] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._6_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[6]);
    auVar30[7] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._7_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[7]);
    auVar30[8] = -((uchar)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish ==
                  hash.super_base_blob<256U>.m_data._M_elems[8]);
    auVar30[9] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish._1_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[9]);
    auVar30[10] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_finish._2_1_ ==
                   hash.super_base_blob<256U>.m_data._M_elems[10]);
    auVar30[0xb] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish._3_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar30[0xc] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish._4_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar30[0xd] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish._5_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar30[0xe] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish._6_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar30[0xf] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish._7_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar30 = auVar30 & auVar34;
    local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) != 0xffff);
    local_1b0.m_message.px = (element_type *)0x0;
    local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    criticalblock17.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1b2c742;
    criticalblock17.super_unique_lock._8_8_ =
         (long)"m_node.chainman->ActiveChain().Tip()->GetBlockHash() != block.GetHash()" + 0x47;
    local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
    local_248._0_8_ = &PTR__lazy_ostream_013ae1c8;
    local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_258 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_250 = "";
    pvVar25 = (iterator)0x1;
    pvVar27 = (iterator)0x0;
    local_230 = &criticalblock17;
    boost::test_tools::tt_detail::report_assertion
              (&local_1b0,(lazy_ostream *)&local_248,1,0,WARN,_cVar38,(size_t)&local_258,0x49);
    boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&oneSpend);
    local_268 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_260 = "";
    local_278 = &boost::unit_test::basic_cstring<char_const>::null;
    local_270 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x4d;
    file_01.m_begin = (iterator)&local_268;
    msg_01.m_end = pvVar27;
    msg_01.m_begin = pvVar25;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_278,
               msg_01);
    _cVar38 = 0x6b4ae5;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         test_method::anon_class_8_1_8991fb9c::operator()
                   ((anon_class_8_1_8991fb9c *)this,
                    spends.
                    super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._1_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._2_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._3_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._4_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._5_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._6_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._7_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    local_248._0_8_ = "ToMemPool(spends[0])";
    local_248.m_message.px = (element_type *)0xf70df4;
    hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae1c8;
    hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_288 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_280 = "";
    pvVar27 = (iterator)0x0;
    hash.super_base_blob<256U>.m_data._M_elems._24_8_ = (lazy_ostream *)&local_248;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&vchSig,(lazy_ostream *)&hash,1,0,WARN,_cVar38,(size_t)&local_288
               ,0x4d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pvVar25 = (iterator)0x0;
    TestChain100Setup::CreateAndProcessBlock
              ((CBlock *)&hash,(TestChain100Setup *)this,&spends,
               (CScript *)&local_f8.indirect_contents,(Chainstate *)0x0);
    puVar23 = &hash;
    puVar24 = (undefined8 *)local_168;
    for (lVar19 = 10;
        psVar17 = local_118.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
        uVar16 = local_118.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish._3_5_,
        uVar15 = local_118.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish._0_3_,
        psVar14 = local_118.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, lVar19 != 0; lVar19 = lVar19 + -1) {
      *puVar24 = *(undefined8 *)(puVar23->super_base_blob<256U>).m_data._M_elems;
      puVar23 = (uint256 *)((long)puVar23 + (ulong)bVar29 * -0x10 + 8);
      puVar24 = puVar24 + (ulong)bVar29 * -2 + 1;
    }
    local_118.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
    local_118.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
    local_118.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_3_ = local_88._8_3_;
    local_118.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._3_5_ = local_88._11_5_;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (uchar)psVar14;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._1_1_ = (uchar)((ulong)psVar14 >> 8);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._2_1_ = (uchar)((ulong)psVar14 >> 0x10);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._3_1_ = (uchar)((ulong)psVar14 >> 0x18);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._4_1_ = (uchar)((ulong)psVar14 >> 0x20);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._5_1_ = (uchar)((ulong)psVar14 >> 0x28);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._6_1_ = (uchar)((ulong)psVar14 >> 0x30);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._7_1_ = (uchar)((ulong)psVar14 >> 0x38);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = (uchar)uVar15;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._1_1_ = (uchar)((uint3)uVar15 >> 8);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._2_1_ = (uchar)((uint3)uVar15 >> 0x10);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._3_1_ = (uchar)uVar16;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._4_1_ = (uchar)((uint5)uVar16 >> 8);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._5_1_ = (uchar)((uint5)uVar16 >> 0x10);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._6_1_ = (uchar)((uint5)uVar16 >> 0x18);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._7_1_ = (uchar)((uint5)uVar16 >> 0x20);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = (uchar)psVar17;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._1_1_ = (uchar)((ulong)psVar17 >> 8);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_1_ = (uchar)((ulong)psVar17 >> 0x10);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = (uchar)((ulong)psVar17 >> 0x18);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = (uchar)((ulong)psVar17 >> 0x20);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_1_ = (uchar)((ulong)psVar17 >> 0x28);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = (uchar)((ulong)psVar17 >> 0x30);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = (uchar)((ulong)psVar17 >> 0x38);
    local_88 = (undefined1  [16])0x0;
    local_78 = (pointer)0x0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)&vchSig);
    auStack_100[2] = local_6e;
    auStack_100[0] = local_70[0];
    auStack_100[1] = local_70[1];
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)local_88);
    oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
    super__Vector_impl_data._0_9_ = ZEXT89(0x13c1538);
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&oneSpend);
    local_298 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_290 = "";
    local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x51;
    file_02.m_begin = (iterator)&local_298;
    msg_02.m_end = pvVar27;
    msg_02.m_begin = pvVar25;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2a8,
               msg_02);
    pCVar20 = ChainstateManager::ActiveChainstate
                        ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    puVar23 = (pCVar20->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish[-1]->phashBlock;
    if (puVar23 != (uint256 *)0x0) {
      hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(puVar23->super_base_blob<256U>).m_data._M_elems;
      hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((puVar23->super_base_blob<256U>).m_data._M_elems + 8);
      hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((puVar23->super_base_blob<256U>).m_data._M_elems + 0x10);
      hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((puVar23->super_base_blob<256U>).m_data._M_elems + 0x18);
      _cVar38 = 0x6b4ccb;
      CBlockHeader::GetHash((uint256 *)&vchSig,(CBlockHeader *)local_168);
      auVar35[0] = -((uchar)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar35[1] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar35[2] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar35[3] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar35[4] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar35[5] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar35[6] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar35[7] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar35[8] = -(uStack_40 == hash.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar35[9] = -(uStack_3f == hash.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar35[10] = -(uStack_3e == hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar35[0xb] = -(uStack_3d == hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar35[0xc] = -(uStack_3c == hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
      auVar35[0xd] = -(uStack_3b == hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
      auVar35[0xe] = -(uStack_3a == hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
      auVar35[0xf] = -(uStack_39 == hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
      auVar31[0] = -((uchar)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_start ==
                    hash.super_base_blob<256U>.m_data._M_elems[0]);
      auVar31[1] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._1_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[1]);
      auVar31[2] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._2_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[2]);
      auVar31[3] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._3_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[3]);
      auVar31[4] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[4]);
      auVar31[5] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._5_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[5]);
      auVar31[6] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._6_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[6]);
      auVar31[7] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._7_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[7]);
      auVar31[8] = -((uchar)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_finish ==
                    hash.super_base_blob<256U>.m_data._M_elems[8]);
      auVar31[9] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish._1_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[9]);
      auVar31[10] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish._2_1_ ==
                     hash.super_base_blob<256U>.m_data._M_elems[10]);
      auVar31[0xb] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish._3_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar31[0xc] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish._4_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar31[0xd] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish._5_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar31[0xe] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish._6_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar31[0xf] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish._7_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar31 = auVar31 & auVar35;
      local_1b0.m_message.px = (element_type *)0x0;
      local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      criticalblock17.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1b2c742;
      criticalblock17.super_unique_lock._8_8_ =
           (long)"m_node.chainman->ActiveChain().Tip()->GetBlockHash() != block.GetHash()" + 0x47;
      local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
      local_248._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_2b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_2b0 = "";
      pvVar25 = (iterator)0x1;
      pvVar27 = (iterator)0x0;
      local_230 = &criticalblock17;
      local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (readonly_property<bool>)
           ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) != 0xffff);
      boost::test_tools::tt_detail::report_assertion
                (&local_1b0,(lazy_ostream *)&local_248,1,0,WARN,_cVar38,(size_t)&local_2b8,0x51);
      boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&oneSpend);
      local_2c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_2c0 = "";
      local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x53;
      file_03.m_begin = (iterator)&local_2c8;
      msg_03.m_end = pvVar27;
      msg_03.m_begin = pvVar25;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d8,
                 msg_03);
      local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
      local_248._0_8_ = &PTR__lazy_ostream_013ae088;
      local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_230 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xf73bdc;
      local_1b8 = (undefined1  [8])
                  CTxMemPool::size((this->super_Dersig100Setup).super_TestChain100Setup.
                                   super_TestingSetup.super_ChainTestingSetup.
                                   super_BasicTestingSetup.m_node.mempool._M_t.
                                   super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                   .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
      criticalblock17.super_unique_lock._M_device = (mutex_type *)local_1b8;
      local_3f8 = (char *)&local_430;
      local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(local_1b8 == (undefined1  [8])0x1);
      local_430._0_4_ = 1;
      local_1b0.m_message.px = (element_type *)0x0;
      local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1b27e1a;
      oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0xf70d5b;
      hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
      hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae0c8;
      hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 8;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._1_1_ = 0xe1;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._2_1_ = 0x3a;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._3_1_ = 1;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._4_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._5_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._6_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._7_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_1_ = 0x21;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ = 0x3c;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      pvVar25 = (iterator)0x1;
      pvVar27 = (iterator)0x2;
      hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &criticalblock17;
      boost::test_tools::tt_detail::report_assertion
                (&local_1b0,(lazy_ostream *)&local_248,1,2,REQUIRE,0xf6ce30,(size_t)&oneSpend,0x53,
                 &hash,"1U",(uint256 *)&vchSig);
      boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
      pRVar21 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                  super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
                  super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                  super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl)->cs;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = (uchar)pRVar21;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._1_1_ = (uchar)((ulong)pRVar21 >> 8);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._2_1_ = (uchar)((ulong)pRVar21 >> 0x10);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._3_1_ = (uchar)((ulong)pRVar21 >> 0x18);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._4_1_ = (uchar)((ulong)pRVar21 >> 0x20);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._5_1_ = (uchar)((ulong)pRVar21 >> 0x28);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._6_1_ = (uchar)((ulong)pRVar21 >> 0x30);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._7_1_ = (uchar)((ulong)pRVar21 >> 0x38);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&vchSig);
      pCVar7 = (this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
               super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
               super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
               super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
               super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
      CTransaction::CTransaction
                ((CTransaction *)&hash,
                 spends.
                 super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      CTxMemPool::removeRecursive(pCVar7,(CTransaction *)&hash,CONFLICT);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                 (hash.super_base_blob<256U>.m_data._M_elems + 0x18));
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)&hash);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&vchSig);
      local_2e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_2e0 = "";
      local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x55;
      file_04.m_begin = (iterator)&local_2e8;
      msg_04.m_end = pvVar27;
      msg_04.m_begin = pvVar25;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2f8,
                 msg_04);
      local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
      local_248._0_8_ = &PTR__lazy_ostream_013ae088;
      local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_230 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xf73bdc;
      local_1b8 = (undefined1  [8])
                  CTxMemPool::size((this->super_Dersig100Setup).super_TestChain100Setup.
                                   super_TestingSetup.super_ChainTestingSetup.
                                   super_BasicTestingSetup.m_node.mempool._M_t.
                                   super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                   .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
      local_430 = (ulong)local_430._4_4_ << 0x20;
      local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(local_1b8 == (undefined1  [8])0x0);
      local_1b0.m_message.px = (element_type *)0x0;
      local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1b27e1a;
      oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0xf70d5b;
      criticalblock17.super_unique_lock._M_device = (mutex_type *)local_1b8;
      hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
      hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae0c8;
      hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_3f8 = (char *)&local_430;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 8;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._1_1_ = 0xe1;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._2_1_ = 0x3a;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._3_1_ = 1;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._4_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._5_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._6_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._7_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_1_ = 0x21;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ = 0x3c;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      pvVar25 = (iterator)0x1;
      pvVar27 = (iterator)0x2;
      hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &criticalblock17;
      boost::test_tools::tt_detail::report_assertion
                (&local_1b0,(lazy_ostream *)&local_248,1,2,REQUIRE,0xf6ce30,(size_t)&oneSpend,0x55,
                 &hash,"0U",(unique_lock<std::recursive_mutex> *)&vchSig);
      boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
      local_308 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_300 = "";
      local_318 = &boost::unit_test::basic_cstring<char_const>::null;
      local_310 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = &DAT_00000058;
      file_05.m_begin = (iterator)&local_308;
      msg_05.m_end = pvVar27;
      msg_05.m_begin = pvVar25;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_318,
                 msg_05);
      _cVar38 = 0x6b5153;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ =
           test_method::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)this,
                      spends.
                      super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._1_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._2_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._3_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._4_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._5_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._6_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._7_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      local_248._0_8_ = "ToMemPool(spends[1])";
      local_248.m_message.px = (element_type *)0xf70e09;
      hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
      hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae1c8;
      hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_328 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_320 = "";
      pvVar27 = (iterator)0x0;
      hash.super_base_blob<256U>.m_data._M_elems._24_8_ = (lazy_ostream *)&local_248;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&vchSig,(lazy_ostream *)&hash,1,0,WARN,_cVar38,
                 (size_t)&local_328,0x58);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      pvVar25 = (iterator)0x0;
      TestChain100Setup::CreateAndProcessBlock
                ((CBlock *)&hash,(TestChain100Setup *)this,&spends,
                 (CScript *)&local_f8.indirect_contents,(Chainstate *)0x0);
      puVar23 = &hash;
      puVar24 = (undefined8 *)local_168;
      for (lVar19 = 10;
          psVar17 = local_118.
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
          uVar16 = local_118.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._3_5_,
          uVar15 = local_118.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._0_3_,
          psVar14 = local_118.
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, lVar19 != 0; lVar19 = lVar19 + -1) {
        *puVar24 = *(undefined8 *)(puVar23->super_base_blob<256U>).m_data._M_elems;
        puVar23 = (uint256 *)((long)puVar23 + (ulong)bVar29 * -0x10 + 8);
        puVar24 = puVar24 + (ulong)bVar29 * -2 + 1;
      }
      local_118.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
      local_118.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
      local_118.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_3_ = local_88._8_3_;
      local_118.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._3_5_ = local_88._11_5_;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = (uchar)psVar14;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._1_1_ = (uchar)((ulong)psVar14 >> 8);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._2_1_ = (uchar)((ulong)psVar14 >> 0x10);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._3_1_ = (uchar)((ulong)psVar14 >> 0x18);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._4_1_ = (uchar)((ulong)psVar14 >> 0x20);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._5_1_ = (uchar)((ulong)psVar14 >> 0x28);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._6_1_ = (uchar)((ulong)psVar14 >> 0x30);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._7_1_ = (uchar)((ulong)psVar14 >> 0x38);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = (uchar)uVar15;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._1_1_ = (uchar)((uint3)uVar15 >> 8);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._2_1_ = (uchar)((uint3)uVar15 >> 0x10);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._3_1_ = (uchar)uVar16;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._4_1_ = (uchar)((uint5)uVar16 >> 8);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._5_1_ = (uchar)((uint5)uVar16 >> 0x10);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._6_1_ = (uchar)((uint5)uVar16 >> 0x18);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._7_1_ = (uchar)((uint5)uVar16 >> 0x20);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = (uchar)psVar17;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_1_ = (uchar)((ulong)psVar17 >> 8);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ = (uchar)((ulong)psVar17 >> 0x10);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = (uchar)((ulong)psVar17 >> 0x18);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = (uchar)((ulong)psVar17 >> 0x20);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = (uchar)((ulong)psVar17 >> 0x28);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = (uchar)((ulong)psVar17 >> 0x30);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = (uchar)((ulong)psVar17 >> 0x38);
      local_88 = (undefined1  [16])0x0;
      local_78 = (pointer)0x0;
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)&vchSig);
      auStack_100[2] = local_6e;
      auStack_100[0] = local_70[0];
      auStack_100[1] = local_70[1];
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)local_88);
      oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl
      .super__Vector_impl_data._0_9_ = ZEXT89(0x13c1538);
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&oneSpend);
      local_338 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_330 = "";
      local_348 = &boost::unit_test::basic_cstring<char_const>::null;
      local_340 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0x5c;
      file_06.m_begin = (iterator)&local_338;
      msg_06.m_end = pvVar27;
      msg_06.m_begin = pvVar25;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_348,
                 msg_06);
      pCVar20 = ChainstateManager::ActiveChainstate
                          ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                           super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      puVar23 = (pCVar20->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish[-1]->phashBlock;
      if (puVar23 != (uint256 *)0x0) {
        hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
             *(undefined8 *)(puVar23->super_base_blob<256U>).m_data._M_elems;
        hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
             *(undefined8 *)((puVar23->super_base_blob<256U>).m_data._M_elems + 8);
        hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
             *(undefined8 *)((puVar23->super_base_blob<256U>).m_data._M_elems + 0x10);
        hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
             *(undefined8 *)((puVar23->super_base_blob<256U>).m_data._M_elems + 0x18);
        _cVar38 = 0x6b5333;
        CBlockHeader::GetHash((uint256 *)&vchSig,(CBlockHeader *)local_168);
        uStack_40 = (uchar)&local_3f8;
        uStack_3f = (uchar)((ulong)&local_3f8 >> 8);
        uStack_3e = (uchar)((ulong)&local_3f8 >> 0x10);
        uStack_3d = (uchar)((ulong)&local_3f8 >> 0x18);
        uStack_3c = (uchar)((ulong)&local_3f8 >> 0x20);
        uStack_3b = (uchar)((ulong)&local_3f8 >> 0x28);
        uStack_3a = (uchar)((ulong)&local_3f8 >> 0x30);
        uStack_39 = (uchar)((ulong)&local_3f8 >> 0x38);
        auVar36[0] = -((uchar)vchSig.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar36[1] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar36[2] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar36[3] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar36[4] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar36[5] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar36[6] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar36[7] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar36[8] = -(uStack_40 == hash.super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar36[9] = -(uStack_3f == hash.super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar36[10] = -(uStack_3e == hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar36[0xb] = -(uStack_3d == hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar36[0xc] = -(uStack_3c == hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar36[0xd] = -(uStack_3b == hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar36[0xe] = -(uStack_3a == hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar36[0xf] = -(uStack_39 == hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
        auVar32[0] = -((uchar)vchSig.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start ==
                      hash.super_base_blob<256U>.m_data._M_elems[0]);
        auVar32[1] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._1_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[1]);
        auVar32[2] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._2_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[2]);
        auVar32[3] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._3_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[3]);
        auVar32[4] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[4]);
        auVar32[5] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._5_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[5]);
        auVar32[6] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._6_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[6]);
        auVar32[7] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._7_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[7]);
        auVar32[8] = -((uchar)vchSig.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish ==
                      hash.super_base_blob<256U>.m_data._M_elems[8]);
        auVar32[9] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish._1_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[9]);
        auVar32[10] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish._2_1_ ==
                       hash.super_base_blob<256U>.m_data._M_elems[10]);
        auVar32[0xb] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish._3_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0xb]);
        auVar32[0xc] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish._4_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0xc]);
        auVar32[0xd] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish._5_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0xd]);
        auVar32[0xe] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish._6_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0xe]);
        auVar32[0xf] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish._7_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0xf]);
        auVar32 = auVar32 & auVar36;
        local_1b0.m_message.px = (element_type *)0x0;
        local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
        criticalblock17.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1b2c742;
        criticalblock17.super_unique_lock._8_8_ =
             (long)"m_node.chainman->ActiveChain().Tip()->GetBlockHash() != block.GetHash()" + 0x47;
        local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
        local_248._0_8_ = &PTR__lazy_ostream_013ae1c8;
        local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_358 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
        ;
        local_350 = "";
        pvVar25 = (iterator)0x1;
        pvVar27 = (iterator)0x0;
        local_230 = &criticalblock17;
        local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)
             (readonly_property<bool>)
             ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) != 0xffff);
        boost::test_tools::tt_detail::report_assertion
                  (&local_1b0,(lazy_ostream *)&local_248,1,0,WARN,_cVar38,(size_t)&local_358,0x5c);
        boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)&oneSpend);
        local_368 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
        ;
        local_360 = "";
        local_378 = &boost::unit_test::basic_cstring<char_const>::null;
        local_370 = &boost::unit_test::basic_cstring<char_const>::null;
        file_07.m_end = (iterator)0x5e;
        file_07.m_begin = (iterator)&local_368;
        msg_07.m_end = pvVar27;
        msg_07.m_begin = pvVar25;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_378
                   ,msg_07);
        local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
        local_248._0_8_ = &PTR__lazy_ostream_013ae088;
        local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_230 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xf73bdc;
        local_1b8 = (undefined1  [8])
                    CTxMemPool::size((this->super_Dersig100Setup).super_TestChain100Setup.
                                     super_TestingSetup.super_ChainTestingSetup.
                                     super_BasicTestingSetup.m_node.mempool._M_t.
                                     super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                     .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
        local_430._0_4_ = 1;
        local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(local_1b8 == (undefined1  [8])0x1);
        local_1b0.m_message.px = (element_type *)0x0;
        local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
        oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1b27e1a;
        oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0xf70d5b;
        criticalblock17.super_unique_lock._M_device = (mutex_type *)local_1b8;
        hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
             hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
        hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae0c8;
        hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_3f8 = (char *)&local_430;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = 8;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._1_1_ = 0xe1;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._2_1_ = 0x3a;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._3_1_ = 1;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._4_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._5_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._6_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._7_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._1_1_ = 0x21;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._2_1_ = 0x3c;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        pvVar25 = (iterator)0x1;
        pvVar27 = (iterator)0x2;
        hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &criticalblock17;
        boost::test_tools::tt_detail::report_assertion
                  (&local_1b0,(lazy_ostream *)&local_248,1,2,REQUIRE,0xf6ce30,(size_t)&oneSpend,0x5e
                   ,&hash,"1U",(uint256 *)&vchSig);
        boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
        pRVar21 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                    super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl)->cs;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = (uchar)pRVar21;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._1_1_ = (uchar)((ulong)pRVar21 >> 8);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._2_1_ = (uchar)((ulong)pRVar21 >> 0x10);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._3_1_ = (uchar)((ulong)pRVar21 >> 0x18);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._4_1_ = (uchar)((ulong)pRVar21 >> 0x20);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._5_1_ = (uchar)((ulong)pRVar21 >> 0x28);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._6_1_ = (uchar)((ulong)pRVar21 >> 0x30);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._7_1_ = (uchar)((ulong)pRVar21 >> 0x38);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&vchSig);
        pCVar7 = (this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                 super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
                 super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                 super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                 super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
        CTransaction::CTransaction
                  ((CTransaction *)&hash,
                   spends.
                   super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1);
        CTxMemPool::removeRecursive(pCVar7,(CTransaction *)&hash,CONFLICT);
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                   (hash.super_base_blob<256U>.m_data._M_elems + 0x18));
        std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)&hash);
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)&vchSig);
        local_388 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
        ;
        local_380 = "";
        local_398 = &boost::unit_test::basic_cstring<char_const>::null;
        local_390 = &boost::unit_test::basic_cstring<char_const>::null;
        file_08.m_end = (iterator)0x60;
        file_08.m_begin = (iterator)&local_388;
        msg_08.m_end = pvVar27;
        msg_08.m_begin = pvVar25;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_398
                   ,msg_08);
        local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
        local_248._0_8_ = &PTR__lazy_ostream_013ae088;
        local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_230 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xf73bdc;
        local_1b8 = (undefined1  [8])
                    CTxMemPool::size((this->super_Dersig100Setup).super_TestChain100Setup.
                                     super_TestingSetup.super_ChainTestingSetup.
                                     super_BasicTestingSetup.m_node.mempool._M_t.
                                     super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                     .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
        local_430 = (ulong)local_430._4_4_ << 0x20;
        local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(readonly_property<bool>)(local_1b8 == (undefined1  [8])0x0);
        local_1b0.m_message.px = (element_type *)0x0;
        local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
        oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0xf70d5b;
        oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
        ;
        criticalblock17.super_unique_lock._M_device = (mutex_type *)local_1b8;
        hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
             hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
        hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae0c8;
        hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_3f8 = (char *)&local_430;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = 8;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._1_1_ = 0xe1;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._2_1_ = 0x3a;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._3_1_ = 1;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._4_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._5_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._6_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._7_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._1_1_ = 0x21;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._2_1_ = 0x3c;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        pvVar25 = (iterator)0x1;
        pvVar27 = (iterator)0x2;
        hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &criticalblock17;
        boost::test_tools::tt_detail::report_assertion
                  (&local_1b0,(lazy_ostream *)&local_248,1,2,REQUIRE,0xf6ce30,(size_t)&oneSpend,0x60
                   ,&hash,"0U",(unique_lock<std::recursive_mutex> *)&vchSig);
        boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
        oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
        _M_impl.super__Vector_impl_data._0_9_ = 0;
        oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
        _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::push_back
                  (&oneSpend,
                   spends.
                   super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        local_3a8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
        ;
        local_3a0 = "";
        local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_09.m_end = (iterator)0x65;
        file_09.m_begin = (iterator)&local_3a8;
        msg_09.m_end = pvVar27;
        msg_09.m_begin = pvVar25;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3b8
                   ,msg_09);
        _cVar38 = 0x6b57e5;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ =
             test_method::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)this,
                        spends.
                        super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._1_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._2_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._3_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._4_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._5_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._6_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._7_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        local_248._0_8_ = "ToMemPool(spends[1])";
        local_248.m_message.px = (element_type *)0xf70e09;
        hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
             hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
        hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae1c8;
        hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_3c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
        ;
        local_3c0 = "";
        pvVar27 = (iterator)0x0;
        hash.super_base_blob<256U>.m_data._M_elems._24_8_ = (lazy_ostream *)&local_248;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&vchSig,(lazy_ostream *)&hash,1,0,WARN,_cVar38,
                   (size_t)&local_3c8,0x65);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
        pvVar25 = (iterator)0x0;
        TestChain100Setup::CreateAndProcessBlock
                  ((CBlock *)&hash,(TestChain100Setup *)this,&oneSpend,
                   (CScript *)&local_f8.indirect_contents,(Chainstate *)0x0);
        puVar23 = &hash;
        puVar24 = (undefined8 *)local_168;
        for (lVar19 = 10;
            psVar17 = local_118.
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
            uVar16 = local_118.
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish._3_5_,
            uVar15 = local_118.
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish._0_3_,
            psVar14 = local_118.
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, lVar19 != 0; lVar19 = lVar19 + -1)
        {
          *puVar24 = *(undefined8 *)(puVar23->super_base_blob<256U>).m_data._M_elems;
          puVar23 = (uint256 *)((long)puVar23 + (ulong)bVar29 * -0x10 + 8);
          puVar24 = puVar24 + (ulong)bVar29 * -2 + 1;
        }
        local_118.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
        local_118.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
        local_118.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_3_ = local_88._8_3_;
        local_118.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._3_5_ = local_88._11_5_;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = (uchar)psVar14;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._1_1_ = (uchar)((ulong)psVar14 >> 8);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._2_1_ = (uchar)((ulong)psVar14 >> 0x10);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._3_1_ = (uchar)((ulong)psVar14 >> 0x18);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._4_1_ = (uchar)((ulong)psVar14 >> 0x20);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._5_1_ = (uchar)((ulong)psVar14 >> 0x28);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._6_1_ = (uchar)((ulong)psVar14 >> 0x30);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._7_1_ = (uchar)((ulong)psVar14 >> 0x38);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = (uchar)uVar15;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._1_1_ = (uchar)((uint3)uVar15 >> 8);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._2_1_ = (uchar)((uint3)uVar15 >> 0x10);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._3_1_ = (uchar)uVar16;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._4_1_ = (uchar)((uint5)uVar16 >> 8);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._5_1_ = (uchar)((uint5)uVar16 >> 0x10);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._6_1_ = (uchar)((uint5)uVar16 >> 0x18);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._7_1_ = (uchar)((uint5)uVar16 >> 0x20);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = (uchar)psVar17;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._1_1_ = (uchar)((ulong)psVar17 >> 8);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._2_1_ = (uchar)((ulong)psVar17 >> 0x10);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = (uchar)((ulong)psVar17 >> 0x18);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_1_ = (uchar)((ulong)psVar17 >> 0x20);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = (uchar)((ulong)psVar17 >> 0x28);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = (uchar)((ulong)psVar17 >> 0x30);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = (uchar)((ulong)psVar17 >> 0x38);
        local_88 = (undefined1  [16])0x0;
        local_78 = (pointer)0x0;
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)&vchSig);
        auStack_100[2] = local_6e;
        auStack_100[0] = local_70[0];
        auStack_100[1] = local_70[1];
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)local_88);
        criticalblock17.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
        criticalblock17.super_unique_lock._8_8_ =
             criticalblock17.super_unique_lock._8_8_ & 0xffffffffffffff00;
        std::unique_lock<std::recursive_mutex>::lock(&criticalblock17.super_unique_lock);
        local_3d8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
        ;
        local_3d0 = "";
        local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_10.m_end = (iterator)0x69;
        file_10.m_begin = (iterator)&local_3d8;
        msg_10.m_end = pvVar27;
        msg_10.m_begin = pvVar25;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3e8
                   ,msg_10);
        pCVar20 = ChainstateManager::ActiveChainstate
                            ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup
                             .super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                             .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
        puVar23 = (pCVar20->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1]->phashBlock;
        if (puVar23 != (uint256 *)0x0) {
          hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
               *(undefined8 *)(puVar23->super_base_blob<256U>).m_data._M_elems;
          hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
               *(undefined8 *)((puVar23->super_base_blob<256U>).m_data._M_elems + 8);
          hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
               *(undefined8 *)((puVar23->super_base_blob<256U>).m_data._M_elems + 0x10);
          hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
               *(undefined8 *)((puVar23->super_base_blob<256U>).m_data._M_elems + 0x18);
          _cVar38 = 0x6b59b7;
          CBlockHeader::GetHash((uint256 *)&vchSig,(CBlockHeader *)local_168);
          uStack_40 = (uchar)&local_3f8;
          uStack_3f = (uchar)((ulong)&local_3f8 >> 8);
          uStack_3e = (uchar)((ulong)&local_3f8 >> 0x10);
          uStack_3d = (uchar)((ulong)&local_3f8 >> 0x18);
          uStack_3c = (uchar)((ulong)&local_3f8 >> 0x20);
          uStack_3b = (uchar)((ulong)&local_3f8 >> 0x28);
          uStack_3a = (uchar)((ulong)&local_3f8 >> 0x30);
          uStack_39 = (uchar)((ulong)&local_3f8 >> 0x38);
          auVar37[0] = -((uchar)vchSig.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage ==
                        hash.super_base_blob<256U>.m_data._M_elems[0x10]);
          auVar37[1] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0x11]);
          auVar37[2] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0x12]);
          auVar37[3] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0x13]);
          auVar37[4] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0x14]);
          auVar37[5] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0x15]);
          auVar37[6] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0x16]);
          auVar37[7] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0x17]);
          auVar37[8] = -(uStack_40 == hash.super_base_blob<256U>.m_data._M_elems[0x18]);
          auVar37[9] = -(uStack_3f == hash.super_base_blob<256U>.m_data._M_elems[0x19]);
          auVar37[10] = -(uStack_3e == hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
          auVar37[0xb] = -(uStack_3d == hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
          auVar37[0xc] = -(uStack_3c == hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
          auVar37[0xd] = -(uStack_3b == hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
          auVar37[0xe] = -(uStack_3a == hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
          auVar37[0xf] = -(uStack_39 == hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
          auVar33[0] = -((uchar)vchSig.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start ==
                        hash.super_base_blob<256U>.m_data._M_elems[0]);
          auVar33[1] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[1]);
          auVar33[2] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._2_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[2]);
          auVar33[3] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._3_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[3]);
          auVar33[4] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[4]);
          auVar33[5] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._5_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[5]);
          auVar33[6] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._6_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[6]);
          auVar33[7] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._7_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[7]);
          auVar33[8] = -((uchar)vchSig.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish ==
                        hash.super_base_blob<256U>.m_data._M_elems[8]);
          auVar33[9] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish._1_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[9]);
          auVar33[10] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish._2_1_ ==
                         hash.super_base_blob<256U>.m_data._M_elems[10]);
          auVar33[0xb] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish._3_1_ ==
                          hash.super_base_blob<256U>.m_data._M_elems[0xb]);
          auVar33[0xc] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_1_ ==
                          hash.super_base_blob<256U>.m_data._M_elems[0xc]);
          auVar33[0xd] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish._5_1_ ==
                          hash.super_base_blob<256U>.m_data._M_elems[0xd]);
          auVar33[0xe] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish._6_1_ ==
                          hash.super_base_blob<256U>.m_data._M_elems[0xe]);
          auVar33[0xf] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish._7_1_ ==
                          hash.super_base_blob<256U>.m_data._M_elems[0xf]);
          auVar33 = auVar33 & auVar37;
          local_1b0.m_message.px = (element_type *)0x0;
          local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_3f8 = "m_node.chainman->ActiveChain().Tip()->GetBlockHash() == block.GetHash()";
          local_3f0 = "";
          local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
          local_248._0_8_ = &PTR__lazy_ostream_013ae1c8;
          local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_230 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_3f8;
          local_408 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
          ;
          local_400 = "";
          pvVar25 = (iterator)0x1;
          pvVar27 = (iterator)0x0;
          local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (readonly_property<bool>)
                 ((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff);
          boost::test_tools::tt_detail::report_assertion
                    (&local_1b0,(lazy_ostream *)&local_248,1,0,WARN,_cVar38,(size_t)&local_408,0x69)
          ;
          boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock17.super_unique_lock);
          local_418 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
          ;
          local_410 = "";
          local_428 = &boost::unit_test::basic_cstring<char_const>::null;
          local_420 = &boost::unit_test::basic_cstring<char_const>::null;
          file_11.m_end = (iterator)0x6d;
          file_11.m_begin = (iterator)&local_418;
          msg_11.m_end = pvVar27;
          msg_11.m_begin = pvVar25;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                     (size_t)&local_428,msg_11);
          local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
          local_248._0_8_ = &PTR__lazy_ostream_013ae088;
          local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_230 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xf73bdc;
          local_430 = CTxMemPool::size((this->super_Dersig100Setup).super_TestChain100Setup.
                                       super_TestingSetup.super_ChainTestingSetup.
                                       super_BasicTestingSetup.m_node.mempool._M_t.
                                       super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                       .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
          local_1b8 = (undefined1  [8])&local_434;
          local_434 = 0;
          local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(readonly_property<bool>)(local_430 == 0);
          local_1b0.m_message.px = (element_type *)0x0;
          local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
          criticalblock17.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1b27e1a;
          criticalblock17.super_unique_lock._8_8_ =
               (long)
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
               + 0x69;
          local_3f8 = (char *)&local_430;
          hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
               hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
          hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae0c8;
          hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
          hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_3f8;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = 8;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._1_1_ = 0xe1;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._2_1_ = 0x3a;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._3_1_ = 1;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._4_1_ = 0;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._5_1_ = 0;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._6_1_ = 0;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._7_1_ = 0;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._1_1_ = 0x21;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._2_1_ = 0x3c;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_1b0,(lazy_ostream *)&local_248,1,2,REQUIRE,0xf6ce30,
                     (size_t)&criticalblock17,0x6d,&hash,"0U",(uint256 *)&vchSig);
          boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
          std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector(&oneSpend)
          ;
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector(&local_118);
          std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector(&spends);
          if (0x1c < local_dc) {
            free(local_f8.indirect_contents.indirect);
          }
          if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
            __stack_chk_fail();
          }
          return;
        }
      }
    }
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h",
                0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_FIXTURE_TEST_CASE(tx_mempool_block_doublespend, Dersig100Setup)
{
    // Make sure skipping validation of transactions that were
    // validated going into the memory pool does not allow
    // double-spends in blocks to pass validation when they should not.

    CScript scriptPubKey = CScript() <<  ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;

    const auto ToMemPool = [this](const CMutableTransaction& tx) {
        LOCK(cs_main);

        const MempoolAcceptResult result = m_node.chainman->ProcessTransaction(MakeTransactionRef(tx));
        return result.m_result_type == MempoolAcceptResult::ResultType::VALID;
    };

    // Create a double-spend of mature coinbase txn:
    std::vector<CMutableTransaction> spends;
    spends.resize(2);
    for (int i = 0; i < 2; i++)
    {
        spends[i].version = 1;
        spends[i].vin.resize(1);
        spends[i].vin[0].prevout.hash = m_coinbase_txns[0]->GetHash();
        spends[i].vin[0].prevout.n = 0;
        spends[i].vout.resize(1);
        spends[i].vout[0].nValue = 11*CENT;
        spends[i].vout[0].scriptPubKey = scriptPubKey;

        // Sign:
        std::vector<unsigned char> vchSig;
        uint256 hash = SignatureHash(scriptPubKey, spends[i], 0, SIGHASH_ALL, 0, SigVersion::BASE);
        BOOST_CHECK(coinbaseKey.Sign(hash, vchSig));
        vchSig.push_back((unsigned char)SIGHASH_ALL);
        spends[i].vin[0].scriptSig << vchSig;
    }

    CBlock block;

    // Test 1: block with both of those transactions should be rejected.
    block = CreateAndProcessBlock(spends, scriptPubKey);
    {
        LOCK(cs_main);
        BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->GetBlockHash() != block.GetHash());
    }

    // Test 2: ... and should be rejected if spend1 is in the memory pool
    BOOST_CHECK(ToMemPool(spends[0]));
    block = CreateAndProcessBlock(spends, scriptPubKey);
    {
        LOCK(cs_main);
        BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->GetBlockHash() != block.GetHash());
    }
    BOOST_CHECK_EQUAL(m_node.mempool->size(), 1U);
    WITH_LOCK(m_node.mempool->cs, m_node.mempool->removeRecursive(CTransaction{spends[0]}, MemPoolRemovalReason::CONFLICT));
    BOOST_CHECK_EQUAL(m_node.mempool->size(), 0U);

    // Test 3: ... and should be rejected if spend2 is in the memory pool
    BOOST_CHECK(ToMemPool(spends[1]));
    block = CreateAndProcessBlock(spends, scriptPubKey);
    {
        LOCK(cs_main);
        BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->GetBlockHash() != block.GetHash());
    }
    BOOST_CHECK_EQUAL(m_node.mempool->size(), 1U);
    WITH_LOCK(m_node.mempool->cs, m_node.mempool->removeRecursive(CTransaction{spends[1]}, MemPoolRemovalReason::CONFLICT));
    BOOST_CHECK_EQUAL(m_node.mempool->size(), 0U);

    // Final sanity test: first spend in *m_node.mempool, second in block, that's OK:
    std::vector<CMutableTransaction> oneSpend;
    oneSpend.push_back(spends[0]);
    BOOST_CHECK(ToMemPool(spends[1]));
    block = CreateAndProcessBlock(oneSpend, scriptPubKey);
    {
        LOCK(cs_main);
        BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->GetBlockHash() == block.GetHash());
    }
    // spends[1] should have been removed from the mempool when the
    // block with spends[0] is accepted:
    BOOST_CHECK_EQUAL(m_node.mempool->size(), 0U);
}